

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,char *targetDir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  _func_int **pp_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  long *plVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *pmVar4;
  bool bVar5;
  Encoding EVar6;
  int iVar7;
  char *pcVar8;
  cmDependsC *this_01;
  undefined4 uVar9;
  cmLocalUnixMakefileGenerator3 *this_02;
  pointer pbVar10;
  string lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  string internalRuleFileNameFull;
  string ruleFileNameFull;
  string dir;
  string dirInfoFile;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  allocator local_599;
  cmLocalUnixMakefileGenerator3 *local_598;
  string local_590;
  undefined4 local_56c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  long *local_548 [2];
  long local_538 [2];
  long *local_528 [2];
  long local_518 [2];
  long *local_508;
  long local_500;
  long local_4f8 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *local_4e8;
  long *local_4e0 [2];
  long local_4d0 [2];
  undefined1 local_4c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  byte abStack_4a0 [552];
  undefined1 local_278 [584];
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_598 = this;
  pcVar8 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_4e0,pcVar8,(allocator *)local_4c0);
  std::__cxx11::string::append((char *)local_4e0);
  std::__cxx11::string::append((char *)local_4e0);
  bVar5 = cmMakefile::ReadListFile(this_00,(char *)local_4e0[0]);
  if ((((!bVar5) || (cmSystemTools::s_ErrorOccured != false)) ||
      (cmSystemTools::s_FatalErrorOccured != false)) ||
     (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) {
    cmSystemTools::Error("Directory Information file not found",(char *)0x0,(char *)0x0,(char *)0x0)
    ;
  }
  else {
    pp_Var1 = (_func_int **)(local_4c0 + 0x10);
    local_4c0._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"CMAKE_FORCE_UNIX_PATHS","")
    ;
    pcVar8 = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
    if ((_func_int **)local_4c0._0_8_ != pp_Var1) {
      operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
    }
    if ((pcVar8 != (char *)0x0) && (bVar5 = cmSystemTools::IsOff(pcVar8), !bVar5)) {
      cmSystemTools::s_ForceUnixPaths = true;
    }
    local_4c0._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4c0,"CMAKE_RELATIVE_PATH_TOP_SOURCE","");
    pcVar8 = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
    if ((_func_int **)local_4c0._0_8_ != pp_Var1) {
      operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
    }
    if (pcVar8 != (char *)0x0) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_4c0,
                 &(local_598->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
      cmStateDirectory::SetRelativePathTopSource((cmStateDirectory *)local_4c0,pcVar8);
    }
    local_4c0._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4c0,"CMAKE_RELATIVE_PATH_TOP_BINARY","");
    pcVar8 = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
    if ((_func_int **)local_4c0._0_8_ != pp_Var1) {
      operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
    }
    if (pcVar8 != (char *)0x0) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_4c0,
                 &(local_598->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
      cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)local_4c0,pcVar8);
    }
  }
  std::__cxx11::string::string((string *)&local_508,targetDir,(allocator *)local_4c0);
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_528,local_508,(long)local_508 + local_500);
  std::__cxx11::string::append((char *)local_528);
  plVar3 = local_528[0];
  EVar6 = (*((local_598->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4c0,(char *)plVar3,false,EVar6);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_4c0,true);
  if ((abStack_4a0[(long)*(_func_int **)(local_4c0._0_8_ + -0x18)] & 5) == 0) {
    local_548[0] = local_538;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_548,local_508,(long)local_508 + local_500);
    std::__cxx11::string::append((char *)local_548);
    plVar3 = local_548[0];
    EVar6 = (*((local_598->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,(char *)plVar3,false,EVar6);
    this_02 = local_598;
    bVar5 = ((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0;
    local_56c = (undefined4)
                CONCAT71((int7)((ulong)*(_func_int **)(local_278._0_8_ + -0x18) >> 8),bVar5);
    if (bVar5) {
      WriteDisclaimer(local_598,(ostream *)local_4c0);
      WriteDisclaimer(this_02,(ostream *)local_278);
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_590,"CMAKE_DEPENDS_LANGUAGES","");
      pcVar8 = cmMakefile::GetSafeDefinition(this_00,&local_590);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
      local_568.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_568.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_568.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_590,pcVar8,&local_599);
      cmSystemTools::ExpandListArgument(&local_590,&local_568,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
      pbVar10 = local_568.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar4 = validDeps;
      if (local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_4e8 = pmVar4;
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          pcVar2 = (pbVar10->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_590,pcVar2,pcVar2 + pbVar10->_M_string_length);
          iVar7 = std::__cxx11::string::compare((char *)&local_590);
          if (((iVar7 == 0) ||
              (iVar7 = std::__cxx11::string::compare((char *)&local_590), iVar7 == 0)) ||
             ((iVar7 = std::__cxx11::string::compare((char *)&local_590), iVar7 == 0 ||
              ((iVar7 = std::__cxx11::string::compare((char *)&local_590), iVar7 == 0 ||
               (iVar7 = std::__cxx11::string::compare((char *)&local_590), iVar7 == 0)))))) {
            this_01 = (cmDependsC *)operator_new(0x5a8);
            cmDependsC::cmDependsC
                      (this_01,(cmLocalGenerator *)this_02,targetDir,&local_590,validDeps);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_590);
            if (iVar7 == 0) {
              this_01 = (cmDependsC *)operator_new(0x108);
              cmDependsFortran::cmDependsFortran
                        ((cmDependsFortran *)this_01,(cmLocalGenerator *)this_02);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_590);
              if (iVar7 == 0) {
                this_01 = (cmDependsC *)operator_new(0xb0);
                cmDependsJava::cmDependsJava((cmDependsJava *)this_01);
              }
              else {
                this_01 = (cmDependsC *)0x0;
              }
            }
          }
          if (this_01 != (cmDependsC *)0x0) {
            (this_01->super_cmDepends).LocalGenerator = (cmLocalGenerator *)this_02;
            (this_01->super_cmDepends).FileComparison =
                 ((this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                 CMakeInstance->FileComparison;
            std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).Language);
            plVar3 = local_508;
            pcVar8 = (char *)(this_01->super_cmDepends).TargetDirectory._M_string_length;
            strlen((char *)local_508);
            validDeps = local_4e8;
            this_02 = local_598;
            std::__cxx11::string::_M_replace
                      ((ulong)&(this_01->super_cmDepends).TargetDirectory,0,pcVar8,(ulong)plVar3);
            cmDepends::Write(&this_01->super_cmDepends,(ostream *)local_4c0,(ostream *)local_278);
            (*(this_01->super_cmDepends)._vptr_cmDepends[1])(this_01);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
          }
          pbVar10 = pbVar10 + 1;
          pmVar4 = local_4e8;
        } while (pbVar10 !=
                 local_568.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_568);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    uVar9 = local_56c;
    if (local_548[0] != local_538) {
      operator_delete(local_548[0],local_538[0] + 1);
      uVar9 = local_56c;
    }
  }
  else {
    uVar9 = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508,local_4f8[0] + 1);
  }
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  return SUB41(uVar9,0);
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  const char* targetDir,
  std::map<std::string, cmDepends::DependencyVector>& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  std::string dirInfoFile = this->GetCurrentBinaryDirectory();
  dirInfoFile += cmake::GetCMakeFilesDirectory();
  dirInfoFile += "/CMakeDirectoryInformation.cmake";
  if (mf->ReadListFile(dirInfoFile.c_str()) &&
      !cmSystemTools::GetErrorOccuredFlag()) {
    haveDirectoryInfo = true;
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (const char* force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmSystemTools::IsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    if (const char* relativePathTopSource =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopSource(
        relativePathTopSource);
    }
    if (const char* relativePathTopBinary =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopBinary(
        relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // create the file stream for the depends file
  std::string dir = targetDir;

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  std::string ruleFileNameFull = dir;
  ruleFileNameFull += "/depend.make";
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  std::string internalRuleFileNameFull = dir;
  internalRuleFileNameFull += "/depend.internal";
  cmGeneratedFileStream internalRuleFileStream(
    internalRuleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  const char* langStr = mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES");
  std::vector<std::string> langs;
  cmSystemTools::ExpandListArgument(langStr, langs);
  for (std::vector<std::string>::iterator li = langs.begin();
       li != langs.end(); ++li) {
    // construct the checker
    std::string lang = *li;

    // Create the scanner for this language
    cmDepends* scanner = CM_NULLPTR;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "CUDA") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = new cmDependsC(this, targetDir, lang, &validDeps);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
    else if (lang == "Fortran") {
      scanner = new cmDependsFortran(this);
    } else if (lang == "Java") {
      scanner = new cmDependsJava();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileComparison(
        this->GlobalGenerator->GetCMakeInstance()->GetFileComparison());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(dir.c_str());
      scanner->Write(ruleFileStream, internalRuleFileStream);

      // free the scanner for this language
      delete scanner;
    }
  }

  return true;
}